

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O1

int __thiscall NetOptimize::eliminate_dropout(NetOptimize *this)

{
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **ppvVar1;
  float fVar2;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar3;
  Layer *pLVar4;
  int *piVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  
  pvVar3 = (this->super_ModelWriter).layers;
  lVar8 = (long)(pvVar3->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(pvVar3->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
  if (lVar8 != 0) {
    ppvVar1 = &(this->super_ModelWriter).layers;
    lVar8 = lVar8 >> 3;
    uVar11 = 0xffffffff;
    lVar10 = 0;
    do {
      uVar9 = (ulong)uVar11;
      iVar6 = std::__cxx11::string::compare
                        ((char *)&((*ppvVar1)->
                                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)
                                  ._M_impl.super__Vector_impl_data._M_start[lVar10]->type);
      if (iVar6 == 0) {
        pLVar4 = ((*ppvVar1)->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                 _M_impl.super__Vector_impl_data._M_start[lVar10];
        fVar2 = *(float *)&pLVar4[1]._vptr_Layer;
        if ((fVar2 == 1.0) && (!NAN(fVar2))) {
          iVar6 = (int)lVar10;
          if (-1 < iVar6 + -1) {
            iVar6 = *(pLVar4->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            do {
              iVar7 = std::__cxx11::string::compare
                                ((char *)&((*ppvVar1)->
                                          super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                          )._M_impl.super__Vector_impl_data._M_start[uVar9]->type);
              if (((iVar7 != 0) &&
                  (pLVar4 = ((*ppvVar1)->
                            super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                            _M_impl.super__Vector_impl_data._M_start[uVar9],
                  piVar5 = (pLVar4->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start,
                  (long)*(pointer *)
                         ((long)&(pLVar4->tops).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl + 8) - (long)piVar5 == 4)) && (*piVar5 == iVar6)) {
                iVar6 = (int)uVar9 + 1;
                goto LAB_0014b9b7;
              }
              uVar9 = uVar9 - 1;
            } while (0 < (int)uVar9 + 1);
            iVar6 = 0;
          }
LAB_0014b9b7:
          if (iVar6 != 0) {
            eliminate_dropout();
          }
        }
      }
      lVar10 = lVar10 + 1;
      uVar11 = uVar11 + 1;
    } while (lVar10 != lVar8 + (ulong)(lVar8 == 0));
  }
  return 0;
}

Assistant:

int NetOptimize::eliminate_dropout()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "Dropout")
            continue;

        ncnn::Dropout* dropout = (ncnn::Dropout*)layers[i];
        if (dropout->scale != 1.f)
            continue;

        // Any - Dropout
        int bottom_blob_index = layers[i]->bottoms[0];

        int j = i - 1;
        for (; j >= 0; j--)
        {
            if (layers[j]->type == "ncnnfused")
                continue;

            if (layers[j]->tops.size() != 1)
                continue;

            if (layers[j]->tops[0] == bottom_blob_index)
                break;
        }

        if (j == -1)
            continue;

        ncnn::Layer* any = layers[j];

        fprintf(stderr, "eliminate_dropout %s %s\n", any->name.c_str(), dropout->name.c_str());

        int top_blob_index_final = dropout->tops[0];
        any->tops[0] = top_blob_index_final;
        blobs[top_blob_index_final].producer = j;
        dropout->type = "ncnnfused";
    }

    return 0;
}